

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

KINT32 __thiscall
KDIS::NETWORK::Connection::Receive
          (Connection *this,KOCTET *Buffer,KUINT32 BufferSz,KString *SenderIp)

{
  KException *pKVar1;
  int *piVar2;
  KCHAR8 *pKVar3;
  ssize_t sVar4;
  char *pcVar5;
  long lVar6;
  allocator<char> local_151;
  KString local_150;
  socklen_t local_12c;
  undefined1 local_128 [4];
  socklen_t iSz;
  sockaddr_in ClientAddr;
  allocator<char> local_101;
  KString local_100;
  int local_dc;
  undefined8 uStack_d8;
  KINT32 uiErr;
  timeval tval;
  timeval pTimeout;
  fd_set *__arr;
  undefined1 local_a8 [4];
  uint __i;
  fd_set fd;
  KString *SenderIp_local;
  KUINT32 BufferSz_local;
  KOCTET *Buffer_local;
  Connection *this_local;
  
  fd.fds_bits[0xf] = (__fd_mask)SenderIp;
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    *(undefined8 *)(local_a8 + (ulong)__arr._4_4_ * 8) = 0;
  }
  lVar6 = (long)(this->m_iSocket[1] / 0x40);
  *(ulong *)(local_a8 + lVar6 * 8) =
       1L << ((byte)((long)this->m_iSocket[1] % 0x40) & 0x3f) | *(ulong *)(local_a8 + lVar6 * 8);
  if ((this->m_bBlockingSocket & 1U) == 0) {
    uStack_d8 = 0;
    tval.tv_sec = 1;
    tval.tv_usec = 0;
  }
  else {
    tval.tv_usec = (this->m_blockingTimeout).tv_sec;
  }
  local_dc = select(this->m_iSocket[1] + 1,(fd_set *)local_a8,(fd_set *)0x0,(fd_set *)0x0,
                    (timeval *)&tval.tv_usec);
  if (local_dc != -1) {
    if (local_dc != 0) {
      local_12c = 0x10;
      sVar4 = recvfrom(this->m_iSocket[1],Buffer,(ulong)BufferSz,0,(sockaddr *)local_128,&local_12c)
      ;
      local_dc = (int)sVar4;
      if (local_dc == -1) {
        pKVar1 = (KException *)__cxa_allocate_exception(0x30);
        piVar2 = __errno_location();
        pKVar3 = getErrorText(this,*piVar2);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,pKVar3,&local_151);
        KException::KException(pKVar1,&local_150,0xc);
        __cxa_throw(pKVar1,&KException::typeinfo,KException::~KException);
      }
      if (fd.fds_bits[0xf] != 0) {
        pcVar5 = inet_ntoa((in_addr)iSz);
        std::__cxx11::string::operator=((string *)fd.fds_bits[0xf],pcVar5);
      }
    }
    return local_dc;
  }
  ClientAddr.sin_zero[3] = '\x01';
  pKVar1 = (KException *)__cxa_allocate_exception(0x30);
  piVar2 = __errno_location();
  pKVar3 = getErrorText(this,*piVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,pKVar3,&local_101);
  KException::KException(pKVar1,&local_100,0xc);
  ClientAddr.sin_zero[3] = '\0';
  __cxa_throw(pKVar1,&KException::typeinfo,KException::~KException);
}

Assistant:

KINT32 Connection::Receive(KOCTET *Buffer, KUINT32 BufferSz, KString *SenderIp /*= NULL*/ ) noexcept(false)
{
    // We use fd_set to test the receive socket for readability. This is used in both blocking
    // and none blocking mode however it is primarily here for none blocking mode as it is more
    // efficient to use this method than to continuously poll the socket.
    fd_set fd;
    FD_ZERO( &fd );
    FD_SET( m_iSocket[RECEIVE_SOCK], &fd );
    timeval pTimeout;

    if( !m_bBlockingSocket )
    {
        // If we are using none blocking mode we need to set
        // a time limit to wait for the select function.
        timeval tval;
        tval.tv_sec  = 0;
        tval.tv_usec = 1;
        pTimeout = tval;
    }
    else
    {
        // Even in blocking mode, it can be useful to return
        // occasionally after a long period without data.
        // where (long period == a second or so).
        // This can make clean exits a joy and allow status messages
        // from the same thread
        pTimeout = m_blockingTimeout;
    }

    // Check the socket, do we have data waiting?
    KINT32 uiErr = select( m_iSocket[RECEIVE_SOCK] + 1, &fd, 0, 0, &pTimeout );

    if( uiErr == SOCKET_ERROR )
    {
        THROW_ERROR;
    }

    if( uiErr ) // If none zero we have data waiting
    {
        // Get data from socket
        sockaddr_in ClientAddr;
        socklen_t iSz = sizeof( ClientAddr );
        uiErr = recvfrom( m_iSocket[RECEIVE_SOCK], Buffer, BufferSz, 0, ( sockaddr * )&ClientAddr, &iSz );

        if( uiErr == SOCKET_ERROR )
        {
            THROW_ERROR;
        }

        // Do we need the sending IP address?
        if( SenderIp )
        {
            *SenderIp = inet_ntoa( ClientAddr.sin_addr );
        }
    }

    return uiErr;
}